

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNode.cpp
# Opt level: O0

DDLNode * ODDLParser::DDLNode::create(string *type,string *name,DDLNode *parent)

{
  DDLNode *this;
  DDLNode *local_30;
  DDLNode *node;
  size_t idx;
  DDLNode *parent_local;
  string *name_local;
  string *type_local;
  
  idx = (size_t)parent;
  parent_local = (DDLNode *)name;
  name_local = type;
  node = (DDLNode *)
         std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::size
                   ((vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_> *)
                    s_allocatedNodes);
  this = (DDLNode *)operator_new(0x88);
  DDLNode(this,name_local,&parent_local->m_type,(size_t)node,(DDLNode *)idx);
  local_30 = this;
  std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::push_back
            ((vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_> *)
             s_allocatedNodes,&local_30);
  return local_30;
}

Assistant:

DDLNode *DDLNode::create( const std::string &type, const std::string &name, DDLNode *parent ) {
    const size_t idx( s_allocatedNodes.size() );
    DDLNode *node = new DDLNode( type, name, idx, parent );
    s_allocatedNodes.push_back( node );
    
    return node;
}